

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

FunctionBody *
Js::FunctionBody::NewFromRecycler
          (ScriptContext *scriptContext,char16 *displayName,uint displayNameLength,
          uint displayShortNameOffset,uint nestedCount,Utf8SourceInfo *sourceInfo,
          uint uFunctionNumber,uint uScriptId,LocalFunctionId functionId,Attributes attributes,
          FunctionBodyFlags flags)

{
  Recycler *alloc;
  FunctionBody *this;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  local_68 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x1ee;
  data._32_8_ = sourceInfo;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
  this = (FunctionBody *)new<Memory::Recycler>(0x1e8,alloc,0x78130e);
  FunctionBody(this,scriptContext,displayName,displayNameLength,displayShortNameOffset,nestedCount,
               (Utf8SourceInfo *)data._32_8_,uFunctionNumber,uScriptId,functionId,attributes,flags);
  return this;
}

Assistant:

FunctionBody * FunctionBody::NewFromRecycler(ScriptContext * scriptContext, const char16 * displayName, uint displayNameLength, uint displayShortNameOffset, uint nestedCount,
        Utf8SourceInfo* sourceInfo, uint uFunctionNumber, uint uScriptId, Js::LocalFunctionId  functionId, FunctionInfo::Attributes attributes, FunctionBodyFlags flags
#ifdef PERF_COUNTERS
            , bool isDeserializedFunction
#endif
            )
    {
#ifdef PERF_COUNTERS
            return RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(), FunctionBody, scriptContext, displayName, displayNameLength, displayShortNameOffset, nestedCount, sourceInfo, uFunctionNumber, uScriptId, functionId, attributes, flags, isDeserializedFunction);
#else
            return RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(), FunctionBody, scriptContext, displayName, displayNameLength, displayShortNameOffset, nestedCount, sourceInfo, uFunctionNumber, uScriptId, functionId, attributes, flags);
#endif
    }